

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

void __thiscall solitaire::events::EventsProcessor::processEvent(EventsProcessor *this,Event *event)

{
  bool bVar1;
  MouseLeftButtonDown *event_00;
  MouseMove *event_01;
  Event *event_local;
  EventsProcessor *this_local;
  
  bVar1 = std::
          holds_alternative<solitaire::events::Quit,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                    (event);
  if (bVar1) {
    this->receivedQuitEvent = true;
  }
  else {
    bVar1 = std::
            holds_alternative<solitaire::events::MouseLeftButtonDown,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                      (event);
    if (bVar1) {
      event_00 = std::
                 get<solitaire::events::MouseLeftButtonDown,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                           (event);
      processMouseLeftButtonDownEvent(this,event_00);
    }
    else {
      bVar1 = std::
              holds_alternative<solitaire::events::MouseLeftButtonUp,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                        (event);
      if (bVar1) {
        processMouseLeftButtonUpEvent(this);
      }
      else {
        bVar1 = std::
                holds_alternative<solitaire::events::MouseMove,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                          (event);
        if (bVar1) {
          event_01 = std::
                     get<solitaire::events::MouseMove,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                               (event);
          processMouseMoveEvent(this,event_01);
        }
      }
    }
  }
  return;
}

Assistant:

void EventsProcessor::processEvent(const Event& event) {
    if (std::holds_alternative<Quit>(event))
        receivedQuitEvent = true;
    else if (std::holds_alternative<MouseLeftButtonDown>(event))
        processMouseLeftButtonDownEvent(std::get<MouseLeftButtonDown>(event));
    else if (std::holds_alternative<MouseLeftButtonUp>(event))
        processMouseLeftButtonUpEvent();
    else if (std::holds_alternative<MouseMove>(event))
        processMouseMoveEvent(std::get<MouseMove>(event));
}